

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O2

Gia_Man_t *
Gia_ManCorrSpecReduce(Gia_Man_t *p,int nFrames,int fScorr,Vec_Int_t **pvOutputs,int fRings)

{
  undefined8 uVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Gia_Man_t *p_00;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  uint *puVar12;
  Gia_Man_t *pGVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int local_70;
  
  if (nFrames < 1) {
    pcVar8 = "nFrames > 0";
    uVar7 = 0x70;
  }
  else if (p->nRegs < 1) {
    pcVar8 = "Gia_ManRegNum(p) > 0";
    uVar7 = 0x71;
  }
  else {
    if (p->pReprs != (Gia_Rpr_t *)0x0) {
      iVar18 = fScorr + nFrames;
      Vec_IntFill(&p->vCopies,p->nObjs * iVar18,fScorr);
      Gia_ManSetPhase(p);
      p_00 = Gia_ManStart(p->nObjs * nFrames);
      pcVar8 = Abc_UtilStrsav(p->pName);
      p_00->pName = pcVar8;
      pcVar8 = Abc_UtilStrsav(p->pSpec);
      p_00->pSpec = pcVar8;
      Gia_ManHashAlloc(p_00);
      iVar16 = 0;
      Gia_ObjSetCopyF(p,0,p->pObjs,0);
      while ((iVar16 < p->nRegs &&
             (pGVar9 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar16), pGVar9 != (Gia_Obj_t *)0x0
             ))) {
        iVar3 = Gia_ManAppendCi(p_00);
        Gia_ObjSetCopyF(p,0,pGVar9,iVar3);
        iVar16 = iVar16 + 1;
      }
      iVar16 = 0;
      while ((iVar16 < p->nRegs &&
             (pGVar9 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar16), pGVar9 != (Gia_Obj_t *)0x0
             ))) {
        iVar3 = Gia_ObjId(p,pGVar9);
        pGVar10 = Gia_ObjReprObj(p,iVar3);
        if (pGVar10 != (Gia_Obj_t *)0x0) {
          iVar3 = Gia_ObjCopyF(p,0,pGVar10);
          Gia_ObjSetCopyF(p,0,pGVar9,iVar3);
        }
        iVar16 = iVar16 + 1;
      }
      iVar16 = 0;
      if (iVar18 < 1) {
        iVar18 = 0;
      }
      for (; iVar16 != iVar18; iVar16 = iVar16 + 1) {
        iVar3 = 0;
        Gia_ObjSetCopyF(p,iVar16,p->pObjs,0);
        while ((iVar3 < p->vCis->nSize - p->nRegs &&
               (pGVar9 = Gia_ManCi(p,iVar3), pGVar9 != (Gia_Obj_t *)0x0))) {
          iVar4 = Gia_ManAppendCi(p_00);
          Gia_ObjSetCopyF(p,iVar16,pGVar9,iVar4);
          iVar3 = iVar3 + 1;
        }
      }
      pVVar11 = Vec_IntAlloc(1000);
      *pvOutputs = pVVar11;
      pVVar11 = Vec_IntAlloc(1000);
      if (fRings == 0) {
        lVar15 = 1;
        while ((lVar15 < p->nObjs &&
               (pGVar9 = Gia_ManObj(p,(int)lVar15), pGVar9 != (Gia_Obj_t *)0x0))) {
          iVar16 = Gia_ObjId(p,pGVar9);
          pGVar10 = Gia_ObjReprObj(p,iVar16);
          if (pGVar10 != (Gia_Obj_t *)0x0) {
            if (((uint)p->pReprs[lVar15] & 0xfffffff) == 0) {
              local_70 = 0;
            }
            else {
              local_70 = Gia_ManCorrSpecReal(p_00,p,pGVar10,nFrames,0);
            }
            iVar16 = Gia_ManCorrSpecReal(p_00,p,pGVar9,nFrames,0);
            iVar16 = Abc_LitNotCond(iVar16,((uint)((ulong)*(undefined8 *)pGVar9 >> 0x20) ^
                                           (uint)((ulong)*(undefined8 *)pGVar10 >> 0x20)) >> 0x1f);
            if (local_70 != iVar16) {
              pVVar2 = *pvOutputs;
              iVar18 = Gia_ObjId(p,pGVar10);
              Vec_IntPush(pVVar2,iVar18);
              pVVar2 = *pvOutputs;
              iVar18 = Gia_ObjId(p,pGVar9);
              Vec_IntPush(pVVar2,iVar18);
              iVar16 = Gia_ManHashXor(p_00,local_70,iVar16);
              Vec_IntPush(pVVar11,iVar16);
            }
          }
          lVar15 = lVar15 + 1;
        }
      }
      else {
        for (uVar14 = 1; (long)uVar14 < (long)p->nObjs; uVar14 = uVar14 + 1) {
          iVar16 = (int)uVar14;
          pGVar9 = Gia_ManObj(p,iVar16);
          if (pGVar9 == (Gia_Obj_t *)0x0) break;
          if (((uint)p->pReprs[uVar14] & 0xfffffff) == 0) {
            iVar18 = Gia_ManCorrSpecReal(p_00,p,pGVar9,nFrames,0);
            iVar18 = Abc_LitNotCond(iVar18,(uint)((ulong)*(undefined8 *)pGVar9 >> 0x3f));
            if (iVar18 != 0) {
              Vec_IntPush(*pvOutputs,0);
              Vec_IntPush(*pvOutputs,iVar16);
LAB_0051eb07:
              Vec_IntPush(pVVar11,iVar18);
            }
          }
          else {
            iVar18 = Gia_ObjIsHead(p,iVar16);
            if (iVar18 != 0) {
              puVar12 = (uint *)(p->pNexts + uVar14);
              uVar17 = uVar14 & 0xffffffff;
              while( true ) {
                uVar7 = *puVar12;
                iVar3 = (int)uVar17;
                pGVar10 = Gia_ManObj(p,iVar3);
                iVar18 = Gia_ManCorrSpecReal(p_00,p,pGVar10,nFrames,0);
                if ((long)(int)uVar7 < 1) break;
                pGVar10 = Gia_ManObj(p,uVar7);
                iVar4 = Gia_ManCorrSpecReal(p_00,p,pGVar10,nFrames,0);
                uVar1 = *(undefined8 *)pGVar9;
                pGVar10 = Gia_ManObj(p,iVar3);
                uVar5 = Abc_LitNotCond(iVar18,((uint)((ulong)uVar1 >> 0x20) ^
                                              (uint)((ulong)*(undefined8 *)pGVar10 >> 0x20)) >> 0x1f
                                      );
                uVar1 = *(undefined8 *)pGVar9;
                pGVar10 = Gia_ManObj(p,uVar7);
                uVar6 = Abc_LitNotCond(iVar4,((uint)((ulong)uVar1 >> 0x20) ^
                                             (uint)((ulong)*(undefined8 *)pGVar10 >> 0x20)) >> 0x1f)
                ;
                if (((uVar6 != 1) && (uVar5 != 0)) && (uVar5 != uVar6)) {
                  Vec_IntPush(*pvOutputs,iVar3);
                  Vec_IntPush(*pvOutputs,uVar7);
                  iVar18 = Gia_ManHashAnd(p_00,uVar5,uVar6 ^ 1);
                  Vec_IntPush(pVVar11,iVar18);
                }
                puVar12 = (uint *)(p->pNexts + (int)uVar7);
                uVar17 = (ulong)uVar7;
              }
              pGVar10 = Gia_ManObj(p,iVar16);
              iVar4 = Gia_ManCorrSpecReal(p_00,p,pGVar10,nFrames,0);
              uVar1 = *(undefined8 *)pGVar9;
              pGVar10 = Gia_ManObj(p,iVar3);
              uVar7 = Abc_LitNotCond(iVar18,((uint)((ulong)uVar1 >> 0x20) ^
                                            (uint)((ulong)*(undefined8 *)pGVar10 >> 0x20)) >> 0x1f);
              uVar1 = *(undefined8 *)pGVar9;
              pGVar9 = Gia_ManObj(p,iVar16);
              uVar5 = Abc_LitNotCond(iVar4,((uint)((ulong)uVar1 >> 0x20) ^
                                           (uint)((ulong)*(undefined8 *)pGVar9 >> 0x20)) >> 0x1f);
              if (((uVar5 != 1) && (uVar7 != 0)) && (uVar7 != uVar5)) {
                Vec_IntPush(*pvOutputs,iVar3);
                Vec_IntPush(*pvOutputs,iVar16);
                iVar18 = Gia_ManHashAnd(p_00,uVar7,uVar5 ^ 1);
                goto LAB_0051eb07;
              }
            }
          }
        }
      }
      iVar16 = pVVar11->nSize;
      iVar18 = 0;
      if (iVar16 < 1) {
        iVar16 = 0;
      }
      for (; iVar16 != iVar18; iVar18 = iVar18 + 1) {
        iVar3 = Vec_IntEntry(pVVar11,iVar18);
        Gia_ManAppendCo(p_00,iVar3);
      }
      Vec_IntFree(pVVar11);
      Gia_ManHashStop(p_00);
      Vec_IntErase(&p->vCopies);
      pGVar13 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar13;
    }
    pcVar8 = "p->pReprs != NULL";
    uVar7 = 0x72;
  }
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecCorr.c"
                ,uVar7,"Gia_Man_t *Gia_ManCorrSpecReduce(Gia_Man_t *, int, int, Vec_Int_t **, int)")
  ;
}

Assistant:

Gia_Man_t * Gia_ManCorrSpecReduce( Gia_Man_t * p, int nFrames, int fScorr, Vec_Int_t ** pvOutputs, int fRings )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    Vec_Int_t * vXorLits;
    int f, i, iPrev, iObj, iPrevNew, iObjNew;
    assert( nFrames > 0 );
    assert( Gia_ManRegNum(p) > 0 );
    assert( p->pReprs != NULL );
    Vec_IntFill( &p->vCopies, (nFrames+fScorr)*Gia_ManObjNum(p), -1 );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( nFrames * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ObjSetCopyF( p, 0, Gia_ManConst0(p), 0 );
    Gia_ManForEachRo( p, pObj, i )
        Gia_ObjSetCopyF( p, 0, pObj, Gia_ManAppendCi(pNew) );
    Gia_ManForEachRo( p, pObj, i )
        if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
            Gia_ObjSetCopyF( p, 0, pObj, Gia_ObjCopyF(p, 0, pRepr) );
    for ( f = 0; f < nFrames+fScorr; f++ )
    { 
        Gia_ObjSetCopyF( p, f, Gia_ManConst0(p), 0 );
        Gia_ManForEachPi( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManAppendCi(pNew) );
    }
    *pvOutputs = Vec_IntAlloc( 1000 );
    vXorLits = Vec_IntAlloc( 1000 );
    if ( fRings )
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( Gia_ObjIsConst( p, i ) )
            {
                iObjNew = Gia_ManCorrSpecReal( pNew, p, pObj, nFrames, 0 );
                iObjNew = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pObj) );
                if ( iObjNew != 0 )
                {
                    Vec_IntPush( *pvOutputs, 0 );
                    Vec_IntPush( *pvOutputs, i );
                    Vec_IntPush( vXorLits, iObjNew );
                }
            }
            else if ( Gia_ObjIsHead( p, i ) )
            {
                iPrev = i;
                Gia_ClassForEachObj1( p, i, iObj )
                {
                    iPrevNew = Gia_ManCorrSpecReal( pNew, p, Gia_ManObj(p, iPrev), nFrames, 0 );
                    iObjNew  = Gia_ManCorrSpecReal( pNew, p, Gia_ManObj(p, iObj), nFrames, 0 );
                    iPrevNew = Abc_LitNotCond( iPrevNew, Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iPrev)) );
                    iObjNew  = Abc_LitNotCond( iObjNew,  Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iObj)) );
                    if ( iPrevNew != iObjNew && iPrevNew != 0 && iObjNew != 1 )
                    {
                        Vec_IntPush( *pvOutputs, iPrev );
                        Vec_IntPush( *pvOutputs, iObj );
                        Vec_IntPush( vXorLits, Gia_ManHashAnd(pNew, iPrevNew, Abc_LitNot(iObjNew)) );
                    }
                    iPrev = iObj;
                }
                iObj = i;
                iPrevNew = Gia_ManCorrSpecReal( pNew, p, Gia_ManObj(p, iPrev), nFrames, 0 );
                iObjNew  = Gia_ManCorrSpecReal( pNew, p, Gia_ManObj(p, iObj), nFrames, 0 );
                iPrevNew = Abc_LitNotCond( iPrevNew, Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iPrev)) );
                iObjNew  = Abc_LitNotCond( iObjNew,  Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iObj)) );
                if ( iPrevNew != iObjNew && iPrevNew != 0 && iObjNew != 1 )
                {
                    Vec_IntPush( *pvOutputs, iPrev );
                    Vec_IntPush( *pvOutputs, iObj );
                    Vec_IntPush( vXorLits, Gia_ManHashAnd(pNew, iPrevNew, Abc_LitNot(iObjNew)) );
                }
            }
        }
    }
    else
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
            if ( pRepr == NULL )
                continue;
            iPrevNew = Gia_ObjIsConst(p, i)? 0 : Gia_ManCorrSpecReal( pNew, p, pRepr, nFrames, 0 );
            iObjNew  = Gia_ManCorrSpecReal( pNew, p, pObj, nFrames, 0 );
            iObjNew  = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
            if ( iPrevNew != iObjNew )
            {
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pRepr) );
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pObj) );
                Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, iPrevNew, iObjNew) );
            }
        }
    }
    Vec_IntForEachEntry( vXorLits, iObjNew, i )
        Gia_ManAppendCo( pNew, iObjNew );
    Vec_IntFree( vXorLits );
    Gia_ManHashStop( pNew );
    Vec_IntErase( &p->vCopies );
//Abc_Print( 1, "Before sweeping = %d\n", Gia_ManAndNum(pNew) );
    pNew = Gia_ManCleanup( pTemp = pNew );
//Abc_Print( 1, "After sweeping = %d\n", Gia_ManAndNum(pNew) );
    Gia_ManStop( pTemp );
    return pNew;
}